

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecBit.h
# Opt level: O2

Vec_Bit_t * Vec_BitAlloc(int nCap)

{
  Vec_Bit_t *pVVar1;
  int *piVar2;
  int iVar3;
  
  iVar3 = ((nCap >> 5) + 1) - (uint)((nCap & 0x1fU) == 0);
  pVVar1 = (Vec_Bit_t *)malloc(0x10);
  pVVar1->nSize = 0;
  pVVar1->nCap = iVar3 * 0x20;
  if (iVar3 == 0) {
    piVar2 = (int *)0x0;
  }
  else {
    piVar2 = (int *)malloc((long)iVar3 << 2);
  }
  pVVar1->pArray = piVar2;
  return pVVar1;
}

Assistant:

static inline Vec_Bit_t * Vec_BitAlloc( int nCap )
{
    Vec_Bit_t * p;
    nCap = (nCap >> 5) + ((nCap & 31) > 0);
    p = ABC_ALLOC( Vec_Bit_t, 1 );
    p->nSize  = 0;
    p->nCap   = nCap * 32;
    p->pArray = nCap? ABC_ALLOC( int, nCap ) : NULL;
    return p;
}